

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>::_validate
          (JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq> *this,JsonVal *jsonVal)

{
  ulong uVar1;
  long upper;
  ulong uVar2;
  bool bVar3;
  JsonArrayVal *pJVar4;
  JsonVal *this_00;
  JsonVal *this_01;
  JsonSIntVal *pJVar5;
  ulong *puVar6;
  longlong *plVar7;
  JsonUIntVal *pJVar8;
  unsigned_long_long *puVar9;
  TextLocation *pTVar10;
  TextParseError *exc;
  unsigned_long_long uUpper_1;
  longlong sUpper_1;
  longlong sLower;
  longlong sUpper;
  unsigned_long_long uUpper;
  unsigned_long_long uLower;
  JsonVal *upperJsonVal;
  JsonVal *lowerJsonVal;
  JsonVal *jsonVal_local;
  JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq> *this_local;
  
  JsonArrayValReq::_validate(&this->super_JsonArrayValReq,jsonVal);
  pJVar4 = JsonVal::asArray(jsonVal);
  this_00 = JsonArrayVal::operator[](pJVar4,0);
  pJVar4 = JsonVal::asArray(jsonVal);
  this_01 = JsonArrayVal::operator[](pJVar4,1);
  bVar3 = JsonVal::isUInt(this_00);
  if (bVar3) {
    pJVar8 = JsonVal::asUInt(this_00);
    puVar9 = JsonScalarVal<unsigned_long_long,_(yactfr::internal::JsonValKind)3>::operator*(pJVar8);
    uVar1 = *puVar9;
    bVar3 = JsonVal::isUInt(this_01);
    if (bVar3) {
      pJVar8 = JsonVal::asUInt(this_01);
      puVar9 = JsonScalarVal<unsigned_long_long,_(yactfr::internal::JsonValKind)3>::operator*
                         (pJVar8);
      uVar2 = *puVar9;
      if (uVar2 < uVar1) {
        pTVar10 = JsonVal::loc(jsonVal);
        _throwLowerGtUpper<unsigned_long_long,unsigned_long_long>(uVar1,uVar2,pTVar10);
      }
    }
    else {
      pJVar5 = JsonVal::asSInt(this_01);
      puVar6 = (ulong *)JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>::operator*
                                  (pJVar5);
      uVar2 = *puVar6;
      if ((long)uVar2 < 0) {
        pTVar10 = JsonVal::loc(jsonVal);
        _throwLowerGtUpper<unsigned_long_long,long_long>(uVar1,uVar2,pTVar10);
      }
      if (uVar2 < uVar1) {
        pTVar10 = JsonVal::loc(jsonVal);
        _throwLowerGtUpper<unsigned_long_long,long_long>(uVar1,uVar2,pTVar10);
      }
    }
  }
  else {
    pJVar5 = JsonVal::asSInt(this_00);
    puVar6 = (ulong *)JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>::operator*(pJVar5);
    uVar1 = *puVar6;
    bVar3 = JsonVal::isSInt(this_01);
    if (bVar3) {
      pJVar5 = JsonVal::asSInt(this_01);
      plVar7 = JsonScalarVal<long_long,_(yactfr::internal::JsonValKind)2>::operator*(pJVar5);
      upper = *plVar7;
      if (upper < (long)uVar1) {
        pTVar10 = JsonVal::loc(jsonVal);
        _throwLowerGtUpper<long_long,long_long>(uVar1,upper,pTVar10);
      }
    }
    else if (-1 < (long)uVar1) {
      pJVar8 = JsonVal::asUInt(this_01);
      puVar9 = JsonScalarVal<unsigned_long_long,_(yactfr::internal::JsonValKind)3>::operator*
                         (pJVar8);
      uVar2 = *puVar9;
      if (uVar2 < uVar1) {
        pTVar10 = JsonVal::loc(jsonVal);
        _throwLowerGtUpper<long_long,unsigned_long_long>(uVar1,uVar2,pTVar10);
      }
    }
  }
  return;
}

Assistant:

void _validate(const JsonVal& jsonVal) const override
    {
        try {
            JsonArrayValReq::_validate(jsonVal);

            /*
             * Here's the truth table:
             *
             * ╔════╦════════════╦════════════╦═══════════════════════════╗
             * ║ ID ║ Lower      ║ Upper      ║ Valid?                    ║
             * ╠════╬════════════╬════════════╬═══════════════════════════╣
             * ║ 1  ║ Unsigned   ║ Unsigned   ║ Lower < upper             ║
             * ║ 2  ║ Signed     ║ Signed     ║ Lower < upper             ║
             * ║ 3  ║ Unsigned   ║ Signed ≥ 0 ║ Lower < upper as unsigned ║
             * ║ 4  ║ Unsigned   ║ Signed < 0 ║ No                        ║
             * ║ 5  ║ Signed ≥ 0 ║ Unsigned   ║ Lower as unsigned < upper ║
             * ║ 6  ║ Signed < 0 ║ Unsigned   ║ Yes                       ║
             * ╚════╩════════════╩════════════╩═══════════════════════════╝
             */
            auto& lowerJsonVal = jsonVal.asArray()[0];
            auto& upperJsonVal = jsonVal.asArray()[1];

            if (lowerJsonVal.isUInt()) {
                const auto uLower = *lowerJsonVal.asUInt();

                if (upperJsonVal.isUInt()) {
                    const auto uUpper = *upperJsonVal.asUInt();

                    if (uUpper < uLower) {
                        // ID 1
                        this->_throwLowerGtUpper(uLower, uUpper, jsonVal.loc());
                    }
                } else {
                    const auto sUpper = *upperJsonVal.asSInt();

                    if (sUpper < 0) {
                        // ID 4
                        this->_throwLowerGtUpper(uLower, sUpper, jsonVal.loc());
                    }

                    if (static_cast<unsigned long long>(sUpper) < uLower) {
                        // ID 3
                        this->_throwLowerGtUpper(uLower, sUpper, jsonVal.loc());
                    }
                }
            } else {
                const auto sLower = *lowerJsonVal.asSInt();

                if (upperJsonVal.isSInt()) {
                    const auto sUpper = *upperJsonVal.asSInt();

                    if (sUpper < sLower) {
                        // ID 2
                        this->_throwLowerGtUpper(sLower, sUpper, jsonVal.loc());
                    }
                } else if (sLower >= 0) {
                    const auto uUpper = *upperJsonVal.asUInt();

                    if (uUpper < static_cast<unsigned long long>(sLower)) {
                        // ID 5
                        this->_throwLowerGtUpper(sLower, uUpper, jsonVal.loc());
                    }
                }
            }
        } catch (TextParseError& exc) {
            appendMsgToTextParseError(exc, "Invalid integer range:", jsonVal.loc());
            throw;
        }
    }